

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

int __thiscall ghc::filesystem::path::compare(path *this,path *p)

{
  long lVar1;
  ulong uVar2;
  pointer pcVar3;
  size_type sVar4;
  pointer pcVar5;
  int iVar6;
  uint uVar7;
  string *psVar8;
  size_type sVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  
  if (((((this->_path)._M_string_length < 3) ||
       (pcVar12 = (this->_path)._M_dataplus._M_p, *pcVar12 != '/')) || (pcVar12[1] != '/')) ||
     ((pcVar12[2] == 0x2f || (iVar6 = isprint((int)pcVar12[2]), iVar6 == 0)))) {
    psVar8 = (string *)0x0;
  }
  else {
    psVar8 = (string *)std::__cxx11::string::find((char)this,0x2f);
    if (psVar8 == (string *)0xffffffffffffffff) {
      psVar8 = (string *)(this->_path)._M_string_length;
    }
  }
  if ((((p->_path)._M_string_length < 3) || (pcVar12 = (p->_path)._M_dataplus._M_p, *pcVar12 != '/')
      ) || ((pcVar12[1] != '/' ||
            ((pcVar12[2] == 0x2f || (iVar6 = isprint((int)pcVar12[2]), iVar6 == 0)))))) {
    sVar9 = 0;
  }
  else {
    sVar9 = std::__cxx11::string::find((char)p,0x2f);
    if (sVar9 == 0xffffffffffffffff) {
      sVar9 = (p->_path)._M_string_length;
    }
  }
  uVar7 = std::__cxx11::string::compare((ulong)this,0,psVar8,(ulong)p,0);
  if (uVar7 == 0) {
    if (((((this->_path)._M_string_length < 3) ||
         (pcVar12 = (this->_path)._M_dataplus._M_p, *pcVar12 != '/')) || (pcVar12[1] != '/')) ||
       ((pcVar12[2] == 0x2f || (iVar6 = isprint((int)pcVar12[2]), iVar6 == 0)))) {
      uVar10 = 0;
    }
    else {
      uVar10 = std::__cxx11::string::find((char)this,0x2f);
      if (uVar10 == 0xffffffffffffffff) {
        uVar10 = (this->_path)._M_string_length;
      }
    }
    if (uVar10 < (this->_path)._M_string_length) {
      bVar16 = (this->_path)._M_dataplus._M_p[uVar10] == '/';
    }
    else {
      bVar16 = false;
    }
    if ((((p->_path)._M_string_length < 3) ||
        (pcVar12 = (p->_path)._M_dataplus._M_p, *pcVar12 != '/')) ||
       ((pcVar12[1] != '/' ||
        ((pcVar12[2] == 0x2f || (iVar6 = isprint((int)pcVar12[2]), iVar6 == 0)))))) {
      uVar10 = 0;
    }
    else {
      uVar10 = std::__cxx11::string::find((char)p,0x2f);
      if (uVar10 == 0xffffffffffffffff) {
        uVar10 = (p->_path)._M_string_length;
      }
    }
    uVar2 = (p->_path)._M_string_length;
    if (uVar10 < uVar2) {
      bVar17 = (p->_path)._M_dataplus._M_p[uVar10] == '/';
    }
    else {
      bVar17 = false;
    }
    if (bVar16 == bVar17) {
      uVar10 = (ulong)(int)((int)psVar8 + (uint)bVar16);
      pcVar3 = (this->_path)._M_dataplus._M_p;
      sVar4 = (this->_path)._M_string_length;
      pcVar12 = pcVar3 + uVar10;
      pcVar5 = (p->_path)._M_dataplus._M_p;
      uVar14 = (ulong)(int)((int)sVar9 + (uint)bVar16);
      pcVar11 = pcVar5 + uVar14;
      if ((uVar10 != sVar4) && (uVar14 != uVar2)) {
        lVar15 = 0;
        do {
          if (pcVar12[lVar15] != pcVar11[lVar15]) {
            pcVar12 = pcVar12 + lVar15;
            pcVar11 = pcVar11 + lVar15;
            goto LAB_00107851;
          }
          lVar1 = lVar15 + 1;
        } while ((~uVar10 + sVar4 != lVar15) &&
                (bVar16 = ~uVar14 + uVar2 != lVar15, lVar15 = lVar1, bVar16));
        pcVar12 = pcVar12 + lVar1;
        pcVar11 = pcVar11 + lVar1;
      }
LAB_00107851:
      pcVar13 = pcVar5 + uVar2;
      if (pcVar12 == pcVar3 + sVar4) {
        uVar7 = -(uint)(pcVar11 != pcVar13);
      }
      else {
        uVar7 = 1;
        if (pcVar11 != pcVar13) {
          uVar7 = 0xffffffff;
          if (*pcVar12 != '/') {
            uVar7 = 1;
            if (*pcVar11 != '/') {
              uVar7 = (uint)(*pcVar11 <= *pcVar12) * 2 - 1;
            }
          }
        }
      }
    }
    else {
      uVar7 = bVar16 - 1 | 1;
    }
  }
  return uVar7;
}

Assistant:

GHC_INLINE int path::compare(const path& p) const noexcept
{
#ifdef LWG_2936_BEHAVIOUR
    auto rnl1 = root_name_length();
    auto rnl2 = p.root_name_length();
#ifdef GHC_OS_WINDOWS
    auto rnc = detail::compare_simple_insensitive(_path.c_str(), rnl1, p._path.c_str(), rnl2);
#else
    auto rnc = _path.compare(0, rnl1, p._path, 0, (std::min(rnl1, rnl2)));
#endif
    if (rnc) {
        return rnc;
    }
    bool hrd1 = has_root_directory(), hrd2 = p.has_root_directory();
    if (hrd1 != hrd2) {
        return hrd1 ? 1 : -1;
    }
    if (hrd1) {
        ++rnl1;
        ++rnl2;
    }
    auto iter1 = _path.begin() + static_cast<int>(rnl1);
    auto iter2 = p._path.begin() + static_cast<int>(rnl2);
    while (iter1 != _path.end() && iter2 != p._path.end() && *iter1 == *iter2) {
        ++iter1;
        ++iter2;
    }
    if (iter1 == _path.end()) {
        return iter2 == p._path.end() ? 0 : -1;
    }
    if (iter2 == p._path.end()) {
        return 1;
    }
    if (*iter1 == preferred_separator) {
        return -1;
    }
    if (*iter2 == preferred_separator) {
        return 1;
    }
    return *iter1 < *iter2 ? -1 : 1;
#else  // LWG_2936_BEHAVIOUR
#ifdef GHC_OS_WINDOWS
    auto rnl1 = root_name_length();
    auto rnl2 = p.root_name_length();
    auto rnc = detail::compare_simple_insensitive(_path.c_str(), rnl1, p._path.c_str(), rnl2);
    if (rnc) {
        return rnc;
    }
    return _path.compare(rnl1, std::string::npos, p._path, rnl2, std::string::npos);
#else
    return _path.compare(p._path);
#endif
#endif
}